

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

string * __thiscall
cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this)

{
  cmExportInstallFileGenerator *this_local;
  string *glob;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)&(this->super_cmExportFileGenerator).FileBase);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"-*");
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,(string *)&(this->super_cmExportFileGenerator).FileExt
            );
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::GetConfigImportFileGlob()
{
  std::string glob = this->FileBase;
  glob += "-*";
  glob += this->FileExt;
  return glob;
}